

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBoolean.c
# Opt level: O1

void JsBooleanConstConstruct(JsObject *self,JsObject *thisobj,int argc,JsValue **argv,JsValue *res)

{
  JsObject *pJVar1;
  undefined1 local_50 [8];
  JsValue v0;
  JsValue v;
  
  (*self->Get)(self,"prototype",(int *)0x0,(JsValue *)((long)&v0.u + 8));
  if (argc < 1) {
    v0.type = JS_UNDEFINED;
  }
  else {
    JsToBoolean(*argv,(JsValue *)local_50);
  }
  pJVar1 = JsCreateBooleanObject((JsObject *)v._0_8_,v0.type);
  res->type = JS_OBJECT;
  (res->u).object = pJVar1;
  return;
}

Assistant:

static	void JsBooleanConstConstruct(struct JsObject *self, struct JsObject *thisobj, int argc, struct JsValue **argv, struct JsValue *res){
	struct JsValue v;
	struct JsValue v0;
	(*self->Get)(self,"prototype",NULL,&v);
	struct JsObject*  boolean;
	if(argc<=0){
		boolean = JsCreateBooleanObject(v.u.object,FALSE);
	}else{
		JsToBoolean(argv[0],&v0);
		boolean = JsCreateBooleanObject(v.u.object,v0.u.boolean);
	}
	res->type = JS_OBJECT;
	res->u.object = boolean;
}